

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::anon_unknown_0::CEscapeAndAppendInternal
          (anon_unknown_0 *this,string_view src,Nonnull<std::string_*> dest)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  size_type sVar4;
  const_pointer pvVar5;
  ulong uVar6;
  const_iterator pvVar7;
  byte *pbVar8;
  const_reference pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  uint32_t little_endian_uint32;
  size_t char_len;
  uchar uc;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string_view *__range2;
  char *append_ptr;
  char *local_b8;
  char *absl_raw_log_internal_filename;
  string local_a8 [55];
  allocator<char> local_71;
  undefined1 local_70 [8];
  string death_message;
  size_t new_dest_len;
  size_t cur_dest_len;
  size_t slop_bytes;
  size_t escaped_len;
  Nonnull<std::string_*> dest_local;
  string_view src_local;
  
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src._M_str;
  src_local._M_len = src._M_len;
  dest_local = (Nonnull<std::string_*>)this;
  sVar3 = CEscapedLength(this,src);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&dest_local);
  if (sVar3 == sVar4) {
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&dest_local);
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&dest_local);
    std::__cxx11::string::append((char *)s,(ulong)pvVar5);
  }
  else {
    uVar6 = std::__cxx11::string::size();
    death_message.field_2._8_8_ = uVar6 + sVar3 + 3;
    if ((ulong)death_message.field_2._8_8_ <= uVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,"Check new_dest_len > cur_dest_len failed: ",&local_71);
      std::allocator<char>::~allocator(&local_71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_a8,"std::string size overflow",
                 (allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
      std::__cxx11::string::operator+=((string *)local_70,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)((long)&absl_raw_log_internal_filename + 7));
      local_b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/escaping.cc"
      ;
      append_ptr._4_4_ = 3;
      append_ptr._0_4_ = 0x1d1;
      base_internal::
      AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
      ::operator()((AtomicHook<void(*)(absl::lts_20250127::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                    *)raw_log_internal::internal_log_function_abi_cxx11_,
                   (LogSeverity *)((long)&append_ptr + 4),&local_b8,(int *)&append_ptr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/escaping.cc"
                    ,0x1d1,
                    "void absl::lts_20250127::(anonymous namespace)::CEscapeAndAppendInternal(absl::string_view, absl::Nonnull<std::string *>)"
                   );
    }
    strings_internal::
    AppendUninitializedTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::Append(s,sVar3 + 3);
    __range2 = (string_view *)std::__cxx11::string::operator[]((ulong)s);
    __end2 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)&dest_local);
    pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&dest_local);
    for (; __end2 != pvVar7; __end2 = __end2 + 1) {
      bVar1 = *__end2;
      pbVar8 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)(anonymous_namespace)::kCEscapedLen,
                          (ulong)bVar1);
      bVar2 = *pbVar8;
      pvVar9 = std::array<unsigned_int,_256UL>::operator[]
                         ((array<unsigned_int,_256UL> *)
                          "\\000\\001\\002\\003\\004\\005\\006\\007\\010\\t",(ulong)bVar1);
      little_endian::Store32(__range2,*pvVar9);
      __range2 = (string_view *)((long)&__range2->_M_len + (ulong)bVar2);
    }
    std::__cxx11::string::resize((ulong)s);
  }
  return;
}

Assistant:

void CEscapeAndAppendInternal(absl::string_view src,
                              absl::Nonnull<std::string*> dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  // We keep 3 slop bytes so that we can call `little_endian::Store32`
  // invariably regardless of the length of the escaped character.
  constexpr size_t slop_bytes = 3;
  size_t cur_dest_len = dest->size();
  size_t new_dest_len = cur_dest_len + escaped_len + slop_bytes;
  ABSL_INTERNAL_CHECK(new_dest_len > cur_dest_len, "std::string size overflow");
  strings_internal::AppendUninitializedTraits<std::string>::Append(
      dest, escaped_len + slop_bytes);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (char c : src) {
    unsigned char uc = static_cast<unsigned char>(c);
    size_t char_len = kCEscapedLen[uc];
    uint32_t little_endian_uint32 = kCEscapedLittleEndianUint32Array[uc];
    little_endian::Store32(append_ptr, little_endian_uint32);
    append_ptr += char_len;
  }
  dest->resize(new_dest_len - slop_bytes);
}